

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

int Saig_ManVerifyCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  if (pAig->nRegs < 1) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar4 = pAig->nTruePis + (int)uVar6;
      if (((int)uVar4 < 0) || (pAig->vCis->nSize <= (int)uVar4)) goto LAB_006e7a0a;
      pvVar2 = pAig->vCis->pArray[uVar4];
      uVar4 = (int)uVar6 + 1;
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&p[1].iPo)[uVar6 >> 5] >> ((byte)uVar6 & 0x1f) & 1) << 5);
      uVar6 = (ulong)uVar4;
    } while ((int)uVar4 < pAig->nRegs);
  }
  if (-1 < p->iFrame) {
    iVar7 = 0;
    while( true ) {
      if (0 < pAig->nTruePis) {
        lVar9 = 0;
        do {
          if (pAig->vCis->nSize <= lVar9) goto LAB_006e7a0a;
          pvVar2 = pAig->vCis->pArray[lVar9];
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&p[1].iPo)[(int)((ulong)uVar4 + lVar9) >> 5] >>
                        ((byte)((ulong)uVar4 + lVar9) & 0x1f) & 1) << 5);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAig->nTruePis);
        uVar4 = uVar4 + (int)lVar9;
      }
      pVVar10 = pAig->vObjs;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          pvVar2 = pVVar10->pArray[lVar9];
          if ((pvVar2 != (void *)0x0) &&
             (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7)) {
            *(ulong *)((long)pvVar2 + 0x18) =
                 *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
            pVVar10 = pAig->vObjs;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar10->nSize);
      }
      pVVar10 = pAig->vCos;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          pvVar2 = pVVar10->pArray[lVar9];
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar2 + 8) << 5 ^
                       *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20
                      );
          lVar9 = lVar9 + 1;
          pVVar10 = pAig->vCos;
        } while (lVar9 < pVVar10->nSize);
      }
      iVar5 = p->iFrame;
      if (iVar7 == iVar5) break;
      if (0 < pAig->nRegs) {
        iVar5 = 0;
        do {
          uVar8 = pAig->nTruePos + iVar5;
          if (((((int)uVar8 < 0) || (pAig->vCos->nSize <= (int)uVar8)) ||
              (uVar11 = pAig->nTruePis + iVar5, (int)uVar11 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar11)) goto LAB_006e7a0a;
          pvVar2 = pAig->vCis->pArray[uVar11];
          *(ulong *)((long)pvVar2 + 0x18) =
               *(ulong *)((long)pvVar2 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAig->vCos->pArray[uVar8] + 0x18) & 0x20);
          iVar5 = iVar5 + 1;
        } while (iVar5 < pAig->nRegs);
        iVar5 = p->iFrame;
      }
      bVar3 = iVar5 <= iVar7;
      iVar7 = iVar7 + 1;
      if (bVar3) break;
    }
  }
  if (uVar4 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDup.c"
                  ,0x12f,"int Saig_ManVerifyCex(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar7 = p->iPo;
  if ((-1 < (long)iVar7) && (iVar7 < pAig->vCos->nSize)) {
    uVar4 = *(uint *)((long)pAig->vCos->pArray[iVar7] + 0x18);
    Aig_ManCleanMarkB(pAig);
    return uVar4 >> 5 & 1;
  }
LAB_006e7a0a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManVerifyCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    RetValue = Aig_ManCo(pAig, p->iPo)->fMarkB;
    Aig_ManCleanMarkB(pAig);
    return RetValue;
}